

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_set_schema(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_value *pSchema;
  int iVar1;
  unqlite_col *pCol;
  int iFlag;
  char *pcVar2;
  uint iBool;
  int nByte;
  SyString sName;
  
  if (argc < 2) {
    pcVar2 = "Missing collection name and/or db scheme";
  }
  else if (((argv[1]->iFlags & 0x40) == 0) || ((*(byte *)((argv[1]->x).iVal + 0x40) & 1) == 0)) {
    pcVar2 = "Invalid collection scheme";
  }
  else {
    pcVar2 = jx9_value_to_string(*argv,&nByte);
    if (0 < nByte) {
      sName.nByte = nByte;
      sName.zString = pcVar2;
      pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
      if (pCol == (unqlite_col *)0x0) {
        iBool = 0;
        jx9_context_throw_error_format(pCtx,2,"No such collection \'%z\'",&sName);
      }
      else {
        pSchema = argv[1];
        iBool = 0;
        if (((pSchema->iFlags & 0x40) != 0) && ((*(byte *)((pSchema->x).iVal + 0x40) & 1) != 0)) {
          iVar1 = CollectionSetHeader((unqlite_kv_engine *)0x0,pCol,-1,-1,pSchema);
          iBool = (uint)(iVar1 == 0);
        }
      }
      goto LAB_0011706d;
    }
    pcVar2 = "Invalid collection name";
  }
  jx9_context_throw_error(pCtx,1,pcVar2);
  iBool = 0;
LAB_0011706d:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_set_schema(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or db scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	if( !jx9_value_is_json_object(argv[1]) ){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection scheme");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	rc = UNQLITE_NOOP;
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		/* Set the collection scheme */
		rc = unqliteCollectionSetSchema(pCol,argv[1]);
	}else{
		jx9_context_throw_error_format(pCtx,JX9_CTX_WARNING,
			"No such collection '%z'",
			&sName
			);
	}
	/* Processing result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK);
	return JX9_OK;
}